

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O2

cbtScalar __thiscall
cbtTaskSchedulerDefault::parallelSum
          (cbtTaskSchedulerDefault *this,int iBegin,int iEnd,int grainSize,cbtIParallelSumBody *body
          )

{
  uint uVar1;
  int iVar2;
  ThreadLocalStorage *pTVar3;
  JobQueue *this_00;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  int jobCount;
  int iVar7;
  long lVar8;
  int i;
  int iVar9;
  long lVar10;
  float fVar11;
  CProfileSample __profile_1;
  CProfileSample __profile;
  
  CProfileSample::CProfileSample((CProfileSample *)&__profile,"parallelSum_ThreadSupport");
  if ((grainSize < iEnd - iBegin) && (0 < this->m_numWorkerThreads)) {
    bVar6 = cbtSpinMutex::tryLock(&this->m_antiNestingLock);
    if (bVar6) {
      lVar8 = 0;
      jobCount = (grainSize + -1 + (iEnd - iBegin)) / grainSize;
      this->m_numJobs = jobCount;
      for (lVar10 = 0; lVar10 < this->m_numActiveJobQueues; lVar10 = lVar10 + 1) {
        JobQueue::clearQueue
                  ((JobQueue *)(((this->m_jobQueues).m_data)->m_cachePadding + lVar8 + -0x78),
                   jobCount,0x20);
        lVar8 = lVar8 + 0xb8;
      }
      uVar1 = this->m_numThreads;
      pTVar3 = (this->m_threadLocalStorage).m_data;
      for (lVar8 = 0; (ulong)(~((int)uVar1 >> 0x1f) & uVar1) * 0x38 - lVar8 != 0;
          lVar8 = lVar8 + 0x38) {
        *(undefined4 *)((long)&pTVar3->m_sumResult + lVar8) = 0;
      }
      prepareWorkerThreads(this);
      iVar9 = 1;
      while (iBegin < iEnd) {
        this_00 = (this->m_perThreadJobQueues).m_data[iVar9];
        iVar7 = iBegin + grainSize;
        iVar5 = iEnd;
        if (iVar7 < iEnd) {
          iVar5 = iVar7;
        }
        iVar2 = this_00->m_allocSize;
        pcVar4 = this_00->m_jobMem;
        this_00->m_allocSize = iVar2 + 0x20;
        pTVar3 = (this->m_threadLocalStorage).m_data;
        *(undefined ***)(pcVar4 + iVar2) = &PTR_executeJob_01197ea8;
        *(cbtIParallelSumBody **)(pcVar4 + (long)iVar2 + 8) = body;
        *(ThreadLocalStorage **)(pcVar4 + (long)iVar2 + 0x10) = pTVar3;
        *(int *)(pcVar4 + (long)iVar2 + 0x18) = iBegin;
        *(int *)(pcVar4 + (long)iVar2 + 0x1c) = iVar5;
        JobQueue::submitJob(this_00,(IJob *)(pcVar4 + iVar2));
        iVar9 = iVar9 + 1;
        iBegin = iVar7;
        if (this->m_numThreads <= iVar9) {
          iVar9 = 1;
        }
      }
      wakeWorkers(this,jobCount + -1);
      waitJobs(this);
      fVar11 = 0.0;
      for (lVar8 = 0;
          (ulong)(uint)(~(this->m_numThreads >> 0x1f) & this->m_numThreads) * 0x38 - lVar8 != 0;
          lVar8 = lVar8 + 0x38) {
        fVar11 = fVar11 + *(float *)((long)&((this->m_threadLocalStorage).m_data)->m_sumResult +
                                    lVar8);
      }
      cbtSpinMutex::unlock(&this->m_antiNestingLock);
      goto LAB_00e1b5d9;
    }
  }
  CProfileSample::CProfileSample((CProfileSample *)&__profile_1,"parallelSum_mainThread");
  fVar11 = (float)(**(code **)(*(long *)body + 0x10))(body,iBegin,iEnd);
  CProfileSample::~CProfileSample((CProfileSample *)&__profile_1);
LAB_00e1b5d9:
  CProfileSample::~CProfileSample((CProfileSample *)&__profile);
  return fVar11;
}

Assistant:

virtual cbtScalar parallelSum(int iBegin, int iEnd, int grainSize, const cbtIParallelSumBody& body) BT_OVERRIDE
	{
		BT_PROFILE("parallelSum_ThreadSupport");
		cbtAssert(iEnd >= iBegin);
		cbtAssert(grainSize >= 1);
		int iterationCount = iEnd - iBegin;
		if (iterationCount > grainSize && m_numWorkerThreads > 0 && m_antiNestingLock.tryLock())
		{
			typedef ParallelSumJob JobType;
			int jobCount = (iterationCount + grainSize - 1) / grainSize;
			m_numJobs = jobCount;
			cbtAssert(jobCount >= 2);  // need more than one job for multithreading
			int jobSize = sizeof(JobType);
			for (int i = 0; i < m_numActiveJobQueues; ++i)
			{
				m_jobQueues[i].clearQueue(jobCount, jobSize);
			}

			// initialize summation
			for (int iThread = 0; iThread < m_numThreads; ++iThread)
			{
				m_threadLocalStorage[iThread].m_sumResult = cbtScalar(0);
			}

			// prepare worker threads for incoming work
			prepareWorkerThreads();
			// submit all of the jobs
			int iJob = 0;
			int iThread = kFirstWorkerThreadId;  // first worker thread
			for (int i = iBegin; i < iEnd; i += grainSize)
			{
				cbtAssert(iJob < jobCount);
				int iE = cbtMin(i + grainSize, iEnd);
				JobQueue* jq = m_perThreadJobQueues[iThread];
				cbtAssert(jq);
				cbtAssert((jq - &m_jobQueues[0]) < m_numActiveJobQueues);
				void* jobMem = jq->allocJobMem(jobSize);
				JobType* job = new (jobMem) ParallelSumJob(i, iE, body, &m_threadLocalStorage[0]);  // placement new
				jq->submitJob(job);
				iJob++;
				iThread++;
				if (iThread >= m_numThreads)
				{
					iThread = kFirstWorkerThreadId;  // first worker thread
				}
			}
			wakeWorkers(jobCount - 1);

			// put the main thread to work on emptying the job queue and then wait for all workers to finish
			waitJobs();

			// add up all the thread sums
			cbtScalar sum = cbtScalar(0);
			for (int iThread = 0; iThread < m_numThreads; ++iThread)
			{
				sum += m_threadLocalStorage[iThread].m_sumResult;
			}
			m_antiNestingLock.unlock();
			return sum;
		}
		else
		{
			BT_PROFILE("parallelSum_mainThread");
			// just run on main thread
			return body.sumLoop(iBegin, iEnd);
		}
	}